

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O2

ByteData256 * cfd::core::HashUtil::Sha256D(ByteData256 *__return_storage_ptr__,Pubkey *pubkey)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_28;
  
  Pubkey::GetData((ByteData *)&_Stack_28,pubkey);
  Sha256D(__return_storage_ptr__,(ByteData *)&_Stack_28);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_28);
  return __return_storage_ptr__;
}

Assistant:

ByteData256 HashUtil::Sha256D(const Pubkey &pubkey) {
  return Sha256D(pubkey.GetData());
}